

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

ly_ctx_err_rec * ly_err_new_rec(ly_ctx *ctx)

{
  ly_ht *ht;
  uint32_t hash;
  LY_ERR LVar1;
  ly_ctx_err_rec *plVar2;
  ly_ctx_err_rec *rec;
  ly_ctx_err_rec new;
  ly_ctx_err_rec *local_40;
  undefined8 local_38;
  pthread_t local_30;
  
  local_38 = 0;
  local_30 = pthread_self();
  pthread_mutex_lock((pthread_mutex_t *)&ctx->lyb_hash_lock);
  ht = ctx->err_ht;
  hash = lyht_hash((char *)&local_30,8);
  LVar1 = lyht_insert(ht,&local_38,hash,&local_40);
  pthread_mutex_unlock((pthread_mutex_t *)&ctx->lyb_hash_lock);
  plVar2 = (ly_ctx_err_rec *)0x0;
  if (LVar1 == LY_SUCCESS) {
    plVar2 = local_40;
  }
  return plVar2;
}

Assistant:

static struct ly_ctx_err_rec *
ly_err_new_rec(const struct ly_ctx *ctx)
{
    struct ly_ctx_err_rec new, *rec;
    LY_ERR r;

    /* insert a new record */
    new.err = NULL;
    new.tid = pthread_self();

    /* reuse lock */
    /* LOCK */
    pthread_mutex_lock((pthread_mutex_t *)&ctx->lyb_hash_lock);

    r = lyht_insert(ctx->err_ht, &new, lyht_hash((void *)&new.tid, sizeof new.tid), (void **)&rec);

    /* UNLOCK */
    pthread_mutex_unlock((pthread_mutex_t *)&ctx->lyb_hash_lock);

    return r ? NULL : rec;
}